

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_callback_activate_nolock_(event_base *base,event_callback *evcb)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  unsigned_long uVar4;
  void *pvVar5;
  eventop *peVar6;
  eventop *peVar7;
  long lVar8;
  short sVar9;
  uint uVar10;
  int iVar11;
  int extraout_EAX;
  int iVar12;
  unsigned_long uVar13;
  ulong uVar14;
  undefined8 uVar15;
  event_callback *in_RDX;
  event_callback *extraout_RDX;
  event_callback *extraout_RDX_00;
  event_callback *extraout_RDX_01;
  event_callback *extraout_RDX_02;
  event_callback *extraout_RDX_03;
  event_callback *extraout_RDX_04;
  event_callback *extraout_RDX_05;
  event_callback *extraout_RDX_06;
  event_callback *extraout_RDX_07;
  event_callback *extraout_RDX_08;
  event_callback *extraout_RDX_09;
  event_callback *extraout_RDX_10;
  event_callback *extraout_RDX_11;
  event_callback *extraout_RDX_12;
  event_callback *extraout_RDX_13;
  event_callback *extraout_RDX_14;
  event_callback *extraout_RDX_15;
  ulong uVar16;
  event_callback *extraout_RDX_16;
  _func_void_int_short_void_ptr *p_Var17;
  undefined8 *puVar18;
  event *ev;
  void *pvVar19;
  event_callback *peVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  char *pcVar24;
  char *pcVar25;
  int unaff_R12D;
  evthread_lock_callbacks *unaff_R13;
  timeval *tv;
  bool bVar26;
  
  puVar18 = (undefined8 *)&stack0xffffffffffffffe8;
  p_Var17 = (_func_void_int_short_void_ptr *)0x0;
  iVar12 = 0;
  if ((evcb->evcb_flags & 0x40U) == 0) {
    uVar10 = (ushort)evcb->evcb_flags >> 3 & 5;
    peVar20 = evcb;
    switch(uVar10) {
    case 0:
      iVar12 = 1;
      break;
    case 1:
      goto switchD_001f737b_caseD_1;
    default:
      pvVar19 = base->th_base_lock;
      if (pvVar19 != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,pvVar19);
      }
      event_callback_finalize_nolock_
                (base,(uint)pvVar19,in_RDX,
                 (_func_void_event_callback_ptr_void_ptr *)&switchD_001f737b::switchdataD_00225000);
      if (base->th_base_lock != (void *)0x0) {
        iVar12 = (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        return iVar12;
      }
      return extraout_EAX;
    case 4:
      event_queue_remove_active_later(base,evcb);
      iVar12 = 0;
      break;
    case 5:
      pcVar24 = "0";
      pcVar25 = "event_callback_activate_nolock_";
      uVar15 = 0xbcb;
      goto LAB_001f74e4;
    case 6:
switchD_001f737b_caseD_6:
      *(undefined8 *)((long)puVar18 + -8) = 0x1f921c;
      (*evthread_lock_fns_.unlock)((uint)base,peVar20);
      in_RDX = extraout_RDX_09;
LAB_001f921c:
      pvVar19 = (((event *)unaff_R13)->ev_evcallback).evcb_arg;
      *(undefined8 *)((long)puVar18 + -8) = 0x1f9225;
      (*p_Var17)((int)unaff_R13,(short)pvVar19,in_RDX);
      in_RDX = extraout_RDX_10;
LAB_001f93fa:
      base = (event_base *)*puVar18;
      unaff_R13 = &evthread_lock_fns_;
LAB_001f9405:
      pvVar19 = evcb[10].evcb_arg;
      if (pvVar19 != (void *)0x0) {
        p_Var17 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
        puVar18[-1] = 0x1f9417;
        (*p_Var17)(0,(short)pvVar19,in_RDX);
      }
      evcb[0xb].evcb_flags = 0;
      evcb[0xb].evcb_pri = '\0';
      evcb[0xb].evcb_closure = '\0';
      *(undefined4 *)&evcb[0xb].field_0x14 = 0;
      if (*(int *)&evcb[0xb].evcb_active_next.tqe_prev != 0) {
        *(undefined4 *)&evcb[0xb].evcb_active_next.tqe_prev = 0;
        peVar20 = evcb[0xb].evcb_active_next.tqe_next;
        if (peVar20 != (event_callback *)0x0) {
          puVar18[-1] = 1;
          uVar15 = puVar18[-1];
          puVar18[-1] = 0x1f944a;
          (*evthread_cond_fns_.signal_condition)(peVar20,(int)uVar15);
        }
      }
      if (*(int *)((long)&evcb[5].evcb_cb_union + 4) != 0) {
        puVar18[-1] = 0xffffffffffffffff;
        return (int)puVar18[-1];
      }
      if (*(int *)((long)puVar18 + 0x2c) <= unaff_R12D) {
        return unaff_R12D;
      }
      if ((base != (event_base *)0x0) && (unaff_R12D != 0)) {
        puVar18[-1] = 0x1f946d;
        update_time_cache((event_base *)evcb);
        puVar18[-1] = 0x1f947a;
        gettime((event_base *)evcb,(timeval *)(puVar18 + 1));
        peVar6 = base->evsel;
        peVar7 = (eventop *)puVar18[1];
        bVar26 = SBORROW8((long)peVar7,(long)peVar6);
        lVar8 = (long)peVar7 - (long)peVar6;
        if (peVar7 == peVar6) {
          bVar26 = SBORROW8(puVar18[2],(long)base->evbase);
          lVar8 = puVar18[2] - (long)base->evbase;
        }
        if (bVar26 == lVar8 < 0) {
          return unaff_R12D;
        }
      }
      if (*(int *)&evcb[5].evcb_arg != 0) {
        return unaff_R12D;
      }
      unaff_R13 = *(evthread_lock_callbacks **)puVar18[6];
      if ((event *)unaff_R13 == (event *)0x0) {
        return unaff_R12D;
      }
      if (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x80) == 0) {
        puVar18[-1] = 0x1f8ff3;
        event_queue_remove_active((event_base *)evcb,(event_callback *)unaff_R13);
        in_RDX = extraout_RDX;
        if (event_debug_logging_mask_ != 0) {
          bVar1 = (((event *)unaff_R13)->ev_evcallback).evcb_closure;
          p_Var17 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
          puVar18[-1] = 0x1f9019;
          event_debugx_("event_process_active: event_callback %p, closure %d, call %p",unaff_R13,
                        (ulong)bVar1,p_Var17);
          in_RDX = extraout_RDX_00;
        }
        ev = (event *)0x0;
      }
      else {
        puVar18[-1] = 0x1f9028;
        event_callback_to_event((event_callback *)unaff_R13);
        if (((((event *)unaff_R13)->ev_events & 0x10) == 0) &&
           (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x40) == 0)) {
          puVar18[-1] = 0x1f9040;
          event_del_nolock_((event *)unaff_R13,0);
          in_RDX = extraout_RDX_01;
        }
        else {
          puVar18[-1] = 0x1f904d;
          event_queue_remove_active((event_base *)evcb,(event_callback *)unaff_R13);
          in_RDX = extraout_RDX_02;
        }
        ev = (event *)unaff_R13;
        if (event_debug_logging_mask_ != 0) {
          uVar3 = ((event *)unaff_R13)->ev_res;
          pcVar24 = "EV_READ ";
          if ((uVar3 & 2) == 0) {
            pcVar24 = " ";
          }
          pcVar25 = "EV_WRITE ";
          if ((uVar3 & 4) == 0) {
            pcVar25 = " ";
          }
          pcVar22 = "EV_CLOSED ";
          if (-1 < (char)uVar3) {
            pcVar22 = " ";
          }
          p_Var17 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
          puVar18[-1] = 0x1f90a4;
          event_debugx_("event_process_active: event: %p, %s%s%scall %p",unaff_R13,pcVar24,pcVar25,
                        pcVar22,p_Var17);
          in_RDX = extraout_RDX_03;
        }
      }
      unaff_R12D = unaff_R12D +
                   (uint)(((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x10U) == 0);
      *(evthread_lock_callbacks **)&evcb[0xb].evcb_flags = unaff_R13;
      *(undefined4 *)&evcb[0xb].evcb_active_next.tqe_prev = 0;
      uVar2 = (((event *)unaff_R13)->ev_evcallback).evcb_closure;
      switch(uVar2) {
      case '\0':
        if (ev == (event *)0x0) {
          pcVar24 = "ev != NULL";
          pcVar25 = "event_process_active_single_queue";
          uVar15 = 0x69d;
          goto LAB_001f95ff;
        }
        p_Var17 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        sVar9 = ev->ev_res;
        pvVar19 = evcb[10].evcb_arg;
        unaff_R13 = &evthread_lock_fns_;
        if (pvVar19 != (void *)0x0) {
          puVar18[-1] = 0x1f9255;
          (*evthread_lock_fns_.unlock)(0,pvVar19);
        }
        iVar12 = ev->ev_fd;
        pvVar19 = (ev->ev_evcallback).evcb_arg;
        puVar18[-1] = 0x1f9262;
        (*p_Var17)(iVar12,sVar9,pvVar19);
        base = (event_base *)*puVar18;
        in_RDX = extraout_RDX_11;
        goto LAB_001f9405;
      case '\x01':
        if (ev == (event *)0x0) {
          pcVar24 = "ev != NULL";
          pcVar25 = "event_process_active_single_queue";
          uVar15 = 0x693;
          goto LAB_001f95ff;
        }
        sVar9 = (ev->ev_).ev_signal.ev_ncalls;
        *(short *)(puVar18 + 1) = sVar9;
        if (sVar9 != 0) {
          (ev->ev_).ev_signal.ev_pncalls = (short *)(puVar18 + 1);
        }
        pvVar19 = evcb[10].evcb_arg;
        base = (event_base *)*puVar18;
        unaff_R13 = &evthread_lock_fns_;
        if (pvVar19 != (void *)0x0) {
          puVar18[-1] = 0x1f92a8;
          (*evthread_lock_fns_.unlock)(0,pvVar19);
          in_RDX = extraout_RDX_12;
        }
        do {
          if (*(short *)(puVar18 + 1) == 0) goto LAB_001f9405;
          sVar9 = *(short *)(puVar18 + 1) + -1;
          *(short *)(puVar18 + 1) = sVar9;
          (ev->ev_).ev_signal.ev_ncalls = sVar9;
          if (sVar9 == 0) {
            (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
          }
          iVar12 = ev->ev_fd;
          sVar9 = ev->ev_res;
          pvVar19 = (ev->ev_evcallback).evcb_arg;
          p_Var17 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
          puVar18[-1] = 0x1f92d7;
          (*p_Var17)(iVar12,sVar9,pvVar19);
          pvVar19 = evcb[10].evcb_arg;
          if (pvVar19 == (void *)0x0) {
            iVar12 = *(int *)((long)&evcb[5].evcb_cb_union + 4);
            in_RDX = extraout_RDX_13;
          }
          else {
            puVar18[-1] = 0x1f92e9;
            (*evthread_lock_fns_.lock)(0,pvVar19);
            pvVar19 = evcb[10].evcb_arg;
            iVar12 = *(int *)((long)&evcb[5].evcb_cb_union + 4);
            in_RDX = extraout_RDX_14;
            if (pvVar19 != (void *)0x0) {
              puVar18[-1] = 0x1f9302;
              (*evthread_lock_fns_.unlock)(0,pvVar19);
              in_RDX = extraout_RDX_15;
            }
          }
        } while (iVar12 == 0);
        if (*(short *)(puVar18 + 1) != 0) {
          (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        goto LAB_001f9405;
      case '\x02':
        goto switchD_001f90e3_caseD_2;
      case '\x03':
        p_Var17 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
        peVar20 = (event_callback *)evcb[10].evcb_arg;
        if (peVar20 == (event_callback *)0x0) goto LAB_001f921c;
        base = (event_base *)0x0;
        goto switchD_001f737b_caseD_6;
      case '\x04':
        p_Var17 = (((event *)unaff_R13)->ev_evcallback).evcb_cb_union.evcb_callback;
        evcb[0xb].evcb_flags = 0;
        evcb[0xb].evcb_pri = '\0';
        evcb[0xb].evcb_closure = '\0';
        *(undefined4 *)&evcb[0xb].field_0x14 = 0;
        if (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x40) == 0) {
          pcVar24 = "(evcb->evcb_flags & EVLIST_FINALIZING)";
          pcVar25 = "event_process_active_single_queue";
          uVar15 = 0x6bc;
          goto LAB_001f95ff;
        }
        pvVar19 = evcb[10].evcb_arg;
        if (pvVar19 != (void *)0x0) {
          puVar18[-1] = 0x1f9179;
          (*evthread_lock_fns_.unlock)(0,pvVar19);
          in_RDX = extraout_RDX_07;
        }
        pvVar19 = (((event *)unaff_R13)->ev_evcallback).evcb_arg;
        puVar18[-1] = 0x1f9183;
        (*p_Var17)((int)unaff_R13,(short)pvVar19,in_RDX);
        in_RDX = extraout_RDX_08;
        goto LAB_001f93fa;
      case '\x05':
      case '\x06':
        if (ev == (event *)0x0) {
          pcVar24 = "ev != NULL";
          pcVar25 = "event_process_active_single_queue";
          uVar15 = 0x6ae;
          goto LAB_001f95ff;
        }
        evcb[0xb].evcb_flags = 0;
        evcb[0xb].evcb_pri = '\0';
        evcb[0xb].evcb_closure = '\0';
        *(undefined4 *)&evcb[0xb].field_0x14 = 0;
        if (((((event *)unaff_R13)->ev_evcallback).evcb_flags & 0x40) == 0) {
          pcVar24 = "(evcb->evcb_flags & EVLIST_FINALIZING)";
          pcVar25 = "event_process_active_single_queue";
          uVar15 = 0x6b1;
          goto LAB_001f95ff;
        }
        p_Var17 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
        pvVar19 = evcb[10].evcb_arg;
        unaff_R13 = &evthread_lock_fns_;
        if (pvVar19 != (void *)0x0) {
          puVar18[-1] = 0x1f911e;
          (*evthread_lock_fns_.unlock)(0,pvVar19);
          in_RDX = extraout_RDX_04;
        }
        pvVar19 = (ev->ev_evcallback).evcb_arg;
        puVar18[-1] = 0x1f9127;
        (*p_Var17)((int)ev,(short)pvVar19,in_RDX);
        puVar18[-1] = 0x1f912f;
        event_debug_note_teardown_(ev);
        base = (event_base *)*puVar18;
        in_RDX = extraout_RDX_05;
        if (uVar2 == '\x06') {
          puVar18[-1] = 0x1f9145;
          event_mm_free_(ev);
          in_RDX = extraout_RDX_06;
        }
        goto LAB_001f9405;
      default:
        pcVar24 = "0";
        pcVar25 = "event_process_active_single_queue";
        uVar15 = 0x6c2;
        goto LAB_001f95ff;
      }
    case 7:
      uRamffffffff8b48387d = 0;
      puVar18 = (undefined8 *)&stack0xffffffffffffffd8;
      UINT_0022500c._3_1_ = (char)(&switchD_001f737b::switchdataD_00225000)[uVar10];
      goto LAB_001f9405;
    }
    if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
       (iVar11 = evthread_is_debug_lock_held_(base->th_base_lock), iVar11 == 0)) {
      pcVar24 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
      pcVar25 = "event_queue_insert_active";
      uVar15 = 0xd36;
LAB_001f74e4:
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,uVar15,pcVar24,pcVar25);
    }
    if ((evcb->evcb_flags & 8U) == 0) {
      iVar11 = base->event_count + (uint)((evcb->evcb_flags & 0x10U) == 0);
      base->event_count = iVar11;
      if (iVar11 < base->event_count_max) {
        iVar11 = base->event_count_max;
      }
      base->event_count_max = iVar11;
      *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags | 8;
      iVar11 = base->event_count_active + 1;
      base->event_count_active = iVar11;
      if (iVar11 < base->event_count_active_max) {
        iVar11 = base->event_count_active_max;
      }
      base->event_count_active_max = iVar11;
      bVar1 = evcb->evcb_pri;
      if (base->nactivequeues <= (int)(uint)bVar1) {
        pcVar24 = "evcb->evcb_pri < base->nactivequeues";
        pcVar25 = "event_queue_insert_active";
        uVar15 = 0xd43;
        goto LAB_001f74e4;
      }
      (evcb->evcb_active_next).tqe_next = (event_callback *)0x0;
      (evcb->evcb_active_next).tqe_prev = base->activequeues[bVar1].tqh_last;
      *base->activequeues[bVar1].tqh_last = evcb;
      base->activequeues[evcb->evcb_pri].tqh_last = (event_callback **)evcb;
    }
    if (((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) &&
       (uVar4 = base->th_owner_id, uVar13 = (*evthread_id_fn_)(), uVar4 != uVar13)) {
      evthread_notify_base(base);
    }
  }
switchD_001f737b_caseD_1:
  return iVar12;
switchD_001f90e3_caseD_2:
  if (ev == (event *)0x0) {
    pcVar24 = "ev != NULL";
    pcVar25 = "event_process_active_single_queue";
    uVar15 = 0x697;
LAB_001f95ff:
    puVar18[-1] = 0x1f9606;
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,uVar15,pcVar24,pcVar25);
  }
  uVar14 = (ev->ev_).ev_io.ev_timeout.tv_usec;
  if ((ev->ev_).ev_io.ev_timeout.tv_sec == 0 && uVar14 == 0) goto LAB_001f93c7;
  if (0xfffff < (uVar14 ^ (ev->ev_timeout).tv_usec)) {
    pcVar24 = "is_same_common_timeout(&ev->ev_timeout, &ev->ev_io_timeout)";
    pcVar25 = "event_persist_closure";
    uVar15 = 0x632;
    goto LAB_001f95ff;
  }
  tv = &ev->ev_timeout;
  puVar18[-1] = 0x1f91c3;
  gettime((event_base *)evcb,(timeval *)(puVar18 + 3));
  puVar18[-1] = 0x1f91ce;
  iVar12 = is_common_timeout(tv,(event_base *)evcb);
  uVar14 = (ev->ev_).ev_io.ev_timeout.tv_usec;
  if (iVar12 == 0) {
    if ((ev->ev_res & 1) == 0) {
      uVar10 = 0;
      goto LAB_001f932d;
    }
    uVar16 = (ev->ev_timeout).tv_usec;
    uVar10 = 0;
  }
  else {
    uVar10 = (uint)uVar14 & 0xfff00000;
    uVar14 = (ulong)((uint)uVar14 & 0xfffff);
    if ((ev->ev_res & 1) == 0) {
LAB_001f932d:
      uVar16 = puVar18[4];
      tv = (timeval *)(puVar18 + 3);
    }
    else {
      uVar16 = (ulong)((uint)(ev->ev_timeout).tv_usec & 0xfffff);
    }
  }
  lVar8 = (ev->ev_).ev_io.ev_timeout.tv_sec;
  lVar23 = tv->tv_sec + lVar8;
  puVar18[1] = lVar23;
  uVar16 = uVar16 + uVar14;
  if (999999 < (long)uVar16) {
    lVar23 = lVar23 + 1;
    puVar18[1] = lVar23;
    uVar16 = uVar16 - 1000000;
  }
  lVar21 = puVar18[3];
  if (lVar23 == lVar21) {
    lVar23 = puVar18[4];
    if ((long)uVar16 < lVar23) {
LAB_001f9387:
      lVar21 = lVar21 + lVar8;
      puVar18[1] = lVar21;
      uVar16 = lVar23 + uVar14;
      if (999999 < (long)uVar16) {
        puVar18[1] = lVar21 + 1;
        uVar16 = uVar16 - 1000000;
      }
    }
  }
  else if (lVar23 < lVar21) {
    lVar23 = puVar18[4];
    goto LAB_001f9387;
  }
  puVar18[2] = uVar10 | uVar16;
  puVar18[-1] = 1;
  uVar15 = puVar18[-1];
  puVar18[-1] = 0x1f93c7;
  event_add_nolock_(ev,(timeval *)(puVar18 + 1),(int)uVar15);
LAB_001f93c7:
  p_Var17 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
  pvVar19 = (ev->ev_evcallback).evcb_arg;
  iVar12 = ev->ev_fd;
  sVar9 = ev->ev_res;
  pvVar5 = evcb[10].evcb_arg;
  if (pvVar5 != (void *)0x0) {
    puVar18[-1] = 0x1f93ef;
    (*evthread_lock_fns_.unlock)(0,pvVar5);
  }
  puVar18[-1] = 0x1f93fa;
  (*p_Var17)(iVar12,sVar9,pvVar19);
  in_RDX = extraout_RDX_16;
  goto LAB_001f93fa;
}

Assistant:

int
event_callback_activate_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	int r = 1;

	if (evcb->evcb_flags & EVLIST_FINALIZING)
		return 0;

	switch (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) {
	default:
		EVUTIL_ASSERT(0);
		EVUTIL_FALLTHROUGH;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		r = 0;
		break;
	case EVLIST_ACTIVE:
		return 0;
	case 0:
		break;
	}

	event_queue_insert_active(base, evcb);

	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	return r;
}